

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_find_best_obmc_sub_pixel_tree_up
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV MVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t in_ECX;
  int *in_RDX;
  uint32_t *in_R9;
  MV_COST_PARAMS *in_stack_00000008;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_00000010;
  MV diag_step;
  MV iter_center_mv;
  int iter;
  uint besterr;
  int round;
  int hstep;
  SubpelMvLimits *mv_limits;
  SUBPEL_SEARCH_TYPE subpel_search_type;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  MV_COST_PARAMS *mv_cost_params;
  int iters_per_step;
  int forced_stop;
  int allow_hp;
  MV diag_mv_1;
  uint down_1;
  uint up_1;
  uint right_1;
  uint left_1;
  MV diag_mv;
  uint down;
  uint up;
  uint right;
  uint left;
  MV bottom_mv;
  MV top_mv;
  MV right_mv;
  MV left_mv;
  int dummy;
  MV diag_step_1;
  int has_better_mv;
  MV diag_bias_mv;
  MV col_bias_mv;
  MV row_bias_mv;
  MV_COST_PARAMS *in_stack_fffffffffffffe60;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_fffffffffffffe68;
  MV_COST_PARAMS *in_stack_fffffffffffffe70;
  AV1_COMMON *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int iVar7;
  MV in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  short sVar8;
  undefined2 in_stack_fffffffffffffe8e;
  short sVar9;
  undefined4 in_stack_fffffffffffffe90;
  int iVar10;
  int iVar11;
  int iVar12;
  MV_COST_PARAMS *mv_cost_params_00;
  undefined7 in_stack_fffffffffffffea8;
  char cVar13;
  aom_internal_error_info *sse1_00;
  int *distortion_00;
  undefined4 in_stack_fffffffffffffec0;
  int iVar14;
  undefined1 local_cc [12];
  SUBPEL_SEARCH_VAR_PARAMS *local_c0;
  undefined1 *local_b8;
  int *local_b0;
  aom_internal_error_info *local_a8;
  MV_COST_PARAMS *local_a0;
  int local_94;
  uint32_t local_78;
  MV local_74;
  undefined1 local_70 [24];
  SUBPEL_SEARCH_VAR_PARAMS *local_58;
  undefined1 *local_50;
  int *local_48;
  aom_internal_error_info *local_40;
  MV_COST_PARAMS *local_38;
  MV local_18;
  uint32_t local_14;
  
  uVar2 = (uint)*(byte *)(in_RDX + 4);
  iVar14 = in_RDX[5];
  distortion_00 = in_RDX + 10;
  sse1_00 = (aom_internal_error_info *)(in_RDX + 0x16);
  cVar13 = (char)in_RDX[0x18];
  mv_cost_params_00 = (MV_COST_PARAMS *)(in_RDX + 6);
  iVar12 = 4;
  if ((int)(3 - (uint)((*in_RDX != 0 ^ 0xffU) & 1)) <= (int)(3 - uVar2)) {
    uVar2 = (uint)((*in_RDX != 0 ^ 0xffU) & 1);
  }
  iVar7 = 3 - uVar2;
  *in_R9 = in_ECX;
  iVar11 = iVar7;
  if (cVar13 == '\0') {
    uVar2 = setup_obmc_center_error
                      ((MV *)mv_cost_params_00,(SUBPEL_SEARCH_VAR_PARAMS *)CONCAT44(4,iVar7),
                       (MV_COST_PARAMS *)CONCAT44(0x7fffffff,in_stack_fffffffffffffe90),
                       (uint *)CONCAT26(in_stack_fffffffffffffe8e,
                                        CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                )),(int *)CONCAT44(iVar7,in_stack_fffffffffffffe80))
    ;
  }
  else {
    uVar2 = upsampled_setup_obmc_center_error
                      ((MACROBLOCKD *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe78,(MV *)in_stack_fffffffffffffe70,
                       in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,(uint *)in_stack_00000008
                       ,(int *)CONCAT44(0x7fffffff,in_stack_fffffffffffffe90));
  }
  for (iVar10 = 0; iVar10 < iVar11; iVar10 = iVar10 + 1) {
    local_78 = *in_R9;
    sVar8 = (short)local_78;
    sVar9 = (short)(local_78 >> 0x10);
    local_b8 = &stack0xfffffffffffffe94;
    local_c0 = in_stack_00000010;
    local_cc._4_8_ = in_stack_00000008;
    local_cc._0_2_ = 0;
    local_cc._2_2_ = 0;
    local_b0 = distortion_00;
    local_a8 = sse1_00;
    local_a0 = mv_cost_params_00;
    local_94 = iVar12;
    if (sse1_00->detail[0] == '\0') {
      uVar3 = obmc_check_better_fast
                        ((MV *)CONCAT44(uVar2,iVar10),
                         (MV *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                         (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                         (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,
                         in_stack_fffffffffffffe70,(uint *)local_cc,(uint *)mv_cost_params_00,
                         (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
      uVar4 = obmc_check_better_fast
                        ((MV *)CONCAT44(uVar2,iVar10),
                         (MV *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                         (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                         (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,
                         in_stack_fffffffffffffe70,(uint *)local_cc,(uint *)mv_cost_params_00,
                         (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
      uVar5 = obmc_check_better_fast
                        ((MV *)CONCAT44(uVar2,iVar10),
                         (MV *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                         (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                         (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,
                         in_stack_fffffffffffffe70,(uint *)local_cc,(uint *)mv_cost_params_00,
                         (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
      uVar6 = obmc_check_better_fast
                        ((MV *)CONCAT44(uVar2,iVar10),
                         (MV *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                         (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                         (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,
                         in_stack_fffffffffffffe70,(uint *)local_cc,(uint *)mv_cost_params_00,
                         (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
      local_74 = get_best_diag_step(local_94,uVar3,uVar4,uVar5,uVar6);
      obmc_check_better_fast
                ((MV *)CONCAT44(uVar2,iVar10),
                 (MV *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                 (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                 (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 (uint *)local_cc,(uint *)mv_cost_params_00,
                 (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
    }
    else {
      uVar3 = obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                                (AV1_COMMON *)
                                CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                                (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),(MV *)local_cc,
                                (SubpelMvLimits *)in_stack_00000008,in_stack_00000010,
                                mv_cost_params_00,(uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8)
                                ,&sse1_00->error_code,distortion_00,
                                (int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
      uVar4 = obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                                (AV1_COMMON *)
                                CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                                (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),(MV *)local_cc,
                                (SubpelMvLimits *)local_cc._4_8_,local_c0,mv_cost_params_00,
                                (uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8),
                                &sse1_00->error_code,distortion_00,
                                (int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
      uVar5 = obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                                (AV1_COMMON *)
                                CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                                (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),(MV *)local_cc,
                                (SubpelMvLimits *)local_cc._4_8_,local_c0,mv_cost_params_00,
                                (uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8),
                                &sse1_00->error_code,distortion_00,
                                (int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
      uVar6 = obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                                (AV1_COMMON *)
                                CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                                (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),(MV *)local_cc,
                                (SubpelMvLimits *)local_cc._4_8_,local_c0,mv_cost_params_00,
                                (uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8),
                                &sse1_00->error_code,distortion_00,
                                (int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
      local_74 = get_best_diag_step(local_94,uVar3,uVar4,uVar5,uVar6);
      in_stack_fffffffffffffe78 = (AV1_COMMON *)local_cc;
      obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                        (AV1_COMMON *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                        (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                        (MV *)in_stack_fffffffffffffe78,(SubpelMvLimits *)local_cc._4_8_,local_c0,
                        mv_cost_params_00,(uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8),
                        &sse1_00->error_code,distortion_00,
                        (int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
      in_stack_fffffffffffffe70 = (MV_COST_PARAMS *)local_cc._4_8_;
    }
    in_stack_fffffffffffffe88 = local_74;
    if (((sVar8 != (short)*in_R9) || (sVar9 != *(short *)((long)in_R9 + 2))) && (1 < iVar14)) {
      local_14 = CONCAT22(sVar9,sVar8);
      local_18 = local_74;
      MVar1 = local_18;
      local_50 = &stack0xfffffffffffffe94;
      local_58 = in_stack_00000010;
      local_70._16_8_ = in_stack_00000008;
      local_48 = distortion_00;
      local_40 = sse1_00;
      local_38 = mv_cost_params_00;
      if ((sVar8 != (short)*in_R9) || (sVar9 != *(short *)((long)in_R9 + 2))) {
        local_18.row = local_74.row;
        local_18.col = local_74.col;
        if (sVar8 == (short)*in_R9) {
          local_18.row = -local_18.row;
          MVar1 = local_18;
        }
        else if (sVar9 == *(short *)((long)in_R9 + 2)) {
          local_18.col = -local_18.col;
          MVar1 = local_18;
        }
        local_18 = MVar1;
        local_70._12_2_ = (short)*in_R9 + local_18.row;
        local_70._14_2_ = *(short *)((long)in_R9 + 2);
        local_70._8_2_ = (undefined2)*in_R9;
        local_70._10_2_ = *(short *)((long)in_R9 + 2) + local_18.col;
        local_70._4_2_ = (short)*in_R9 + local_18.row;
        local_70._6_2_ = *(short *)((long)in_R9 + 2) + local_18.col;
        local_70._0_2_ = 0;
        local_70._2_2_ = 0;
        if (sse1_00->detail[0] == '\0') {
          obmc_check_better_fast
                    ((MV *)CONCAT44(uVar2,iVar10),(MV *)CONCAT26(sVar9,CONCAT24(sVar8,local_74)),
                     (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                     (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                     ,(uint *)local_70,(uint *)mv_cost_params_00,
                     (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
          obmc_check_better_fast
                    ((MV *)CONCAT44(uVar2,iVar10),
                     (MV *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                     (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                     (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                     ,(uint *)local_70,(uint *)mv_cost_params_00,
                     (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
          if ((MV)local_70._0_4_ != (MV)0x0) {
            obmc_check_better_fast
                      ((MV *)CONCAT44(uVar2,iVar10),
                       (MV *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                       (SubpelMvLimits *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                       (SUBPEL_SEARCH_VAR_PARAMS *)in_stack_fffffffffffffe78,
                       in_stack_fffffffffffffe70,(uint *)local_70,(uint *)mv_cost_params_00,
                       (int *)CONCAT17(cVar13,in_stack_fffffffffffffea8),(int *)sse1_00);
          }
        }
        else {
          obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                            (AV1_COMMON *)CONCAT26(sVar9,CONCAT24(sVar8,local_74)),
                            (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),(MV *)local_70,
                            (SubpelMvLimits *)in_stack_00000008,in_stack_00000010,mv_cost_params_00,
                            (uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8),&sse1_00->error_code,
                            distortion_00,(int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
          in_stack_fffffffffffffe78 = (AV1_COMMON *)local_70;
          in_stack_fffffffffffffe70 = (MV_COST_PARAMS *)local_70._16_8_;
          obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                            (AV1_COMMON *)CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                            (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                            (MV *)in_stack_fffffffffffffe78,(SubpelMvLimits *)local_70._16_8_,
                            local_58,mv_cost_params_00,
                            (uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8),&sse1_00->error_code,
                            distortion_00,(int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
          if ((MV)local_70._0_4_ != (MV)0x0) {
            in_stack_fffffffffffffe78 = (AV1_COMMON *)local_70;
            obmc_check_better((MACROBLOCKD *)CONCAT44(uVar2,iVar10),
                              (AV1_COMMON *)
                              CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffe88)),
                              (MV *)CONCAT44(iVar7,in_stack_fffffffffffffe80),
                              (MV *)in_stack_fffffffffffffe78,(SubpelMvLimits *)local_70._16_8_,
                              local_58,mv_cost_params_00,
                              (uint *)CONCAT17(cVar13,in_stack_fffffffffffffea8),
                              &sse1_00->error_code,distortion_00,
                              (int *)CONCAT44(iVar14,in_stack_fffffffffffffec0));
            in_stack_fffffffffffffe70 = (MV_COST_PARAMS *)local_70._16_8_;
          }
        }
      }
    }
    iVar12 = iVar12 >> 1;
  }
  return uVar2;
}

Assistant:

int av1_find_best_obmc_sub_pixel_tree_up(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)last_mv_search_list;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  int hstep = INIT_SUBPEL_STEP_SIZE;
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);

  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  if (subpel_search_type != USE_2_TAPS_ORIG)
    besterr = upsampled_setup_obmc_center_error(
        xd, cm, bestmv, var_params, mv_cost_params, sse1, distortion);
  else
    besterr = setup_obmc_center_error(bestmv, var_params, mv_cost_params, sse1,
                                      distortion);

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    MV diag_step = obmc_first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                          mv_limits, var_params, mv_cost_params,
                                          &besterr, sse1, distortion);

    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      obmc_second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                                 mv_limits, var_params, mv_cost_params,
                                 &besterr, sse1, distortion);
    }
    hstep >>= 1;
  }

  return besterr;
}